

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O0

void __thiscall CTPNStmBreak::gen_code(CTPNStmBreak *this,int param_2,int param_3)

{
  int iVar1;
  CTPNStmEnclosing *pCVar2;
  CTPNStmBase *in_RDI;
  
  CTPNStmBase::add_debug_line_rec(in_RDI);
  pCVar2 = CTcCodeStream::get_enclosing(G_cs);
  if (pCVar2 != (CTPNStmEnclosing *)0x0) {
    pCVar2 = CTcCodeStream::get_enclosing(G_cs);
    iVar1 = (*(pCVar2->super_CTPNStm).super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
              _vptr_CTcPrsNodeBase[0x1f])
                      (pCVar2,in_RDI[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase,
                       in_RDI[1].next_stm_);
    if (iVar1 != 0) {
      return;
    }
  }
  if (in_RDI[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase == (_func_int **)0x0) {
    CTcTokenizer::log_error(0x2d03);
  }
  else {
    CTcTokenizer::log_error
              (0x2d08,(ulong)in_RDI[1].next_stm_ & 0xffffffff,
               in_RDI[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase);
  }
  return;
}

Assistant:

void CTPNStmBreak::gen_code(int, int)
{
    /* add a line record */
    add_debug_line_rec();

    /* 
     *   ask the enclosing statement to do the work - if there's no
     *   enclosing statement, or none of the enclosing statements can
     *   perform the break, it's an error 
     */
    if (G_cs->get_enclosing() == 0
        || !G_cs->get_enclosing()->gen_code_break(lbl_, lbl_len_))
    {
        /* 
         *   log the error - if there's a label, the problem is that we
         *   couldn't find the label, otherwise it's that we can't perform
         *   a 'break' here at all 
         */
        if (lbl_ == 0)
            G_tok->log_error(TCERR_INVALID_BREAK);
        else
            G_tok->log_error(TCERR_INVALID_BREAK_LBL, (int)lbl_len_, lbl_);
    }
}